

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

string * path_str(path *path)

{
  path *in_RDI;
  string *u8path;
  path *this;
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::filesystem::__cxx11::path::u8string(this);
  std::__cxx11::string::operator=((string *)this,local_38);
  std::__cxx11::string::~string(local_38);
  return &in_RDI->_M_pathname;
}

Assistant:

static std::string path_str(const fs::path & path) {
    std::string u8path;
    try {
#if defined(__cpp_lib_char8_t)
        // C++20 and later: u8string() returns std::u8string
        std::u8string u8str = path.u8string();
        u8path = std::string(reinterpret_cast<const char*>(u8str.c_str()));
#else
        // C++17: u8string() returns std::string
        u8path = path.u8string();
#endif
    } catch (...) {
    }
    return u8path;
}